

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

int __thiscall llvm::StringRef::compare_numeric(StringRef *this,StringRef RHS)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint unaff_R14D;
  bool bVar18;
  bool bVar19;
  
  uVar7 = RHS.Length;
  pcVar9 = RHS.Data;
  uVar3 = this->Length;
  uVar11 = uVar7;
  if (uVar3 < uVar7) {
    uVar11 = uVar3;
  }
  if (uVar11 != 0) {
    pcVar4 = this->Data;
    uVar17 = 0;
    do {
      bVar1 = pcVar4[uVar17];
      bVar2 = pcVar9[uVar17];
      if ((byte)(bVar2 - 0x30) < 10 && (byte)(bVar1 - 0x30) < 10) {
        lVar6 = 0;
        pcVar10 = pcVar9;
        pcVar12 = pcVar4;
        do {
          pcVar12 = pcVar12 + 1;
          pcVar10 = pcVar10 + 1;
          lVar8 = uVar11 + 1;
          uVar16 = uVar11;
          if ((uVar17 - uVar11) + lVar6 == 0) goto LAB_00da1584;
          uVar16 = uVar17 + lVar6 + 1;
          uVar15 = 0;
          if (uVar16 < uVar3) {
            uVar15 = (uint)((byte)(pcVar12[uVar17] - 0x30U) < 10);
          }
          if (uVar16 < uVar7) {
            bVar18 = (byte)(pcVar10[uVar17] - 0x30U) < 10;
            uVar14 = (uint)bVar18;
            bVar19 = uVar15 == uVar14;
            uVar15 = -uVar14 | 1;
            cVar13 = !bVar18 * '\x05';
          }
          else {
            bVar19 = uVar15 == 0;
            cVar13 = '\x05';
            uVar15 = 1;
          }
          if (!bVar19) {
            cVar13 = '\x01';
            unaff_R14D = uVar15;
          }
          lVar6 = lVar6 + 1;
        } while (cVar13 == '\0');
        if (cVar13 != '\x05') {
          return unaff_R14D;
        }
        lVar8 = uVar17 + lVar6;
        uVar16 = (uVar17 + lVar6) - 1;
LAB_00da1584:
        if ((lVar8 - uVar17 != 0) &&
           (iVar5 = memcmp(pcVar4 + uVar17,pcVar9 + uVar17,lVar8 - uVar17), iVar5 != 0)) {
          return iVar5 >> 0x1f | 1;
        }
      }
      else {
        uVar16 = uVar17;
        if (bVar1 != bVar2) {
          bVar19 = bVar1 < bVar2;
          goto LAB_00da15c5;
        }
      }
      uVar17 = uVar16 + 1;
    } while (uVar17 != uVar11);
  }
  uVar15 = 0;
  if (uVar3 != uVar7) {
    bVar19 = uVar3 < uVar7;
LAB_00da15c5:
    uVar15 = -(uint)bVar19 | 1;
  }
  return uVar15;
}

Assistant:

int StringRef::compare_numeric(StringRef RHS) const {
  for (size_t I = 0, E = std::min(Length, RHS.Length); I != E; ++I) {
    // Check for sequences of digits.
    if (isDigit(Data[I]) && isDigit(RHS.Data[I])) {
      // The longer sequence of numbers is considered larger.
      // This doesn't really handle prefixed zeros well.
      size_t J;
      for (J = I + 1; J != E + 1; ++J) {
        bool ld = J < Length && isDigit(Data[J]);
        bool rd = J < RHS.Length && isDigit(RHS.Data[J]);
        if (ld != rd)
          return rd ? -1 : 1;
        if (!rd)
          break;
      }
      // The two number sequences have the same length (J-I), just memcmp them.
      if (int Res = compareMemory(Data + I, RHS.Data + I, J - I))
        return Res < 0 ? -1 : 1;
      // Identical number sequences, continue search after the numbers.
      I = J - 1;
      continue;
    }
    if (Data[I] != RHS.Data[I])
      return (unsigned char)Data[I] < (unsigned char)RHS.Data[I] ? -1 : 1;
  }
  if (Length == RHS.Length)
    return 0;
  return Length < RHS.Length ? -1 : 1;
}